

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

_Bool request_passphrase(PageantClient *pc,PageantKey *pk)

{
  _Bool _Var1;
  _Bool created_dlg;
  PageantKey *pk_local;
  PageantClient *pc_local;
  
  if ((pk->decryption_prompt_active & 1U) == 0) {
    if (gui_request_in_progress) {
      __assert_fail("!gui_request_in_progress",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                    0x198,"_Bool request_passphrase(PageantClient *, PageantKey *)");
    }
    _Var1 = pageant_client_ask_passphrase(pc,&pk->dlgid,pk->comment);
    if (!_Var1) {
      return false;
    }
    gui_request_in_progress = true;
    pk->decryption_prompt_active = true;
  }
  return true;
}

Assistant:

static bool request_passphrase(PageantClient *pc, PageantKey *pk)
{
    if (!pk->decryption_prompt_active) {
        assert(!gui_request_in_progress);

        bool created_dlg = pageant_client_ask_passphrase(
            pc, &pk->dlgid, pk->comment);

        if (!created_dlg)
            return false;

        gui_request_in_progress = true;
        pk->decryption_prompt_active = true;
    }

    return true;
}